

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O2

void node::RegenerateCommitments(CBlock *block,ChainstateManager *chainman)

{
  int iVar1;
  reference pvVar2;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *this;
  CBlockIndex *pindexPrev;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_98;
  CMutableTransaction tx;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  pointer local_38;
  pointer pCStack_30;
  pointer local_28;
  
  local_28 = *(pointer *)(in_FS_OFFSET + 0x28);
  pvVar2 = std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::at(&block->vtx,0);
  CMutableTransaction::CMutableTransaction
            (&tx,(pvVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  iVar1 = GetWitnessCommitmentIndex(block);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::erase
            (&tx.vout,tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar1);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_48);
  this = &std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::at(&block->vtx,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_48,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/miner.cpp"
             ,0x3e,false);
  pindexPrev = BlockManager::LookupBlockIndex
                         (&chainman->m_blockman,&(block->super_CBlockHeader).hashPrevBlock);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_48);
  ChainstateManager::GenerateCoinbaseCommitment
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_98,chainman,block,
             pindexPrev);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_98);
  BlockMerkleRoot((uint256 *)local_48,block,(bool *)0x0);
  *(pointer *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_38;
  *(pointer *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) =
       pCStack_30;
  *(undefined1 (*) [8])
   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems = local_48;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) =
       _Stack_40._M_pi;
  CMutableTransaction::~CMutableTransaction(&tx);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegenerateCommitments(CBlock& block, ChainstateManager& chainman)
{
    CMutableTransaction tx{*block.vtx.at(0)};
    tx.vout.erase(tx.vout.begin() + GetWitnessCommitmentIndex(block));
    block.vtx.at(0) = MakeTransactionRef(tx);

    const CBlockIndex* prev_block = WITH_LOCK(::cs_main, return chainman.m_blockman.LookupBlockIndex(block.hashPrevBlock));
    chainman.GenerateCoinbaseCommitment(block, prev_block);

    block.hashMerkleRoot = BlockMerkleRoot(block);
}